

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool nodeHasAlignAttr(Node *node)

{
  AttVal *local_20;
  AttVal *av;
  Node *node_local;
  
  local_20 = node->attributes;
  while( true ) {
    if (local_20 == (AttVal *)0x0) {
      return no;
    }
    if (((local_20 != (AttVal *)0x0) && (local_20->dict != (Attribute *)0x0)) &&
       (local_20->dict->id == TidyAttr_ALIGN)) break;
    local_20 = local_20->next;
  }
  return yes;
}

Assistant:

static Bool nodeHasAlignAttr( Node *node )
{
    /* #define attrIsALIGN(av) AttrIsId( av, TidyAttr_ALIGN  ) */
    AttVal* av;
    for ( av = node->attributes; av != NULL; av = av->next ) {
        if (attrIsALIGN(av))
            return yes;
    }
    return no;
}